

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O1

void __thiscall Genome::Attach(Genome *this,Ptr *pol)

{
  Ptr transcript;
  undefined1 local_50 [32];
  Ptr local_30;
  Ptr local_20;
  
  BuildTranscript((Genome *)local_50,(int)this,
                  ((pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  stop_);
  local_20.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_20.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if ((_Base_ptr)
      local_20.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((_Base_ptr)
               local_20.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_parent =
           *(int *)&((_Base_ptr)
                    local_20.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_parent + 1;
      UNLOCK();
    }
    else {
      *(int *)&((_Base_ptr)
               local_20.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_parent =
           *(int *)&((_Base_ptr)
                    local_20.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_parent + 1;
    }
  }
  local_30.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_50._0_8_;
  local_30.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_;
  if ((element_type *)local_50._8_8_ != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((enable_shared_from_this<Polymer> *)(local_50._8_8_ + 8))->_M_weak_this).
               super___weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(((enable_shared_from_this<Polymer> *)(local_50._8_8_ + 8))->_M_weak_this).
                    super___weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((enable_shared_from_this<Polymer> *)(local_50._8_8_ + 8))->_M_weak_this).
               super___weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(((enable_shared_from_this<Polymer> *)(local_50._8_8_ + 8))->_M_weak_this).
                    super___weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
    }
  }
  MobileElementManager::Insert(&(this->super_Polymer).polymerases_,&local_20,&local_30);
  if ((element_type *)
      local_30.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((_Base_ptr)
      local_20.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_50._16_8_ = local_50._0_8_;
  local_50._24_8_ = local_50._8_8_;
  if ((element_type *)local_50._8_8_ != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((enable_shared_from_this<Polymer> *)(local_50._8_8_ + 8))->_M_weak_this).
               super___weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(((enable_shared_from_this<Polymer> *)(local_50._8_8_ + 8))->_M_weak_this).
                    super___weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((enable_shared_from_this<Polymer> *)(local_50._8_8_ + 8))->_M_weak_this).
               super___weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(((enable_shared_from_this<Polymer> *)(local_50._8_8_ + 8))->_M_weak_this).
                    super___weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
    }
  }
  Signal<std::shared_ptr<Transcript>_>::Emit
            (&this->transcript_signal_,(shared_ptr<Transcript> *)(local_50 + 0x10));
  if ((element_type *)local_50._24_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._24_8_);
  }
  if ((element_type *)local_50._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
  }
  return;
}

Assistant:

void Genome::Attach(MobileElement::Ptr pol) {
  Transcript::Ptr transcript = BuildTranscript(pol->stop(), stop_);
  polymerases_.Insert(pol, transcript);
  transcript_signal_.Emit(transcript);
}